

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_settings::set_bool(session_settings *this,int name,bool value)

{
  uint uVar1;
  ulong uVar2;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->m_mutex;
  local_30._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if ((name & 0xc000U) == 0x8000) {
    uVar1 = (name & 0x3fc0U) >> 6;
    uVar2 = 1L << ((byte)name & 0x3f);
    if (value) {
      uVar2 = uVar2 | (this->m_store).m_bools.super__Base_bitset<2UL>._M_w[uVar1];
    }
    else {
      uVar2 = ~uVar2 & (this->m_store).m_bools.super__Base_bitset<2UL>._M_w[uVar1];
    }
    (this->m_store).m_bools.super__Base_bitset<2UL>._M_w[uVar1] = uVar2;
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void set_bool(int name, bool value) override
		{
			std::unique_lock<std::mutex> l(m_mutex);
			m_store.set_bool(name, value);
		}